

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O3

double __thiscall
spdlog::sinks::stdout_sink_base<spdlog::details::console_nullmutex>::log
          (stdout_sink_base<spdlog::details::console_nullmutex> *this,double __x)

{
  formatter *pfVar1;
  undefined8 in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  memory_buf_t formatted;
  undefined **local_130;
  undefined1 *local_128;
  size_t local_120;
  ulong local_118;
  undefined1 local_110 [256];
  
  local_120 = 0;
  local_130 = &PTR_grow_0013b348;
  local_118 = 0xfa;
  pfVar1 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_128 = local_110;
  (*pfVar1->_vptr_formatter[2])(pfVar1,in_RSI,&local_130);
  fwrite(local_128,1,local_120,(FILE *)this->file_);
  fflush((FILE *)this->file_);
  dVar2 = extraout_XMM0_Qa;
  if (local_128 != local_110) {
    operator_delete(local_128,local_118);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

SPDLOG_INLINE void stdout_sink_base<ConsoleMutex>::log(const details::log_msg &msg)
{
#ifdef _WIN32
    if (handle_ == INVALID_HANDLE_VALUE)
    {
        return;
    }
    std::lock_guard<mutex_t> lock(mutex_);
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    ::fflush(file_); // flush in case there is something in this file_ already
    auto size = static_cast<DWORD>(formatted.size());
    DWORD bytes_written = 0;
    bool ok = ::WriteFile(handle_, formatted.data(), size, &bytes_written, nullptr) != 0;
    if (!ok)
    {
        throw_spdlog_ex("stdout_sink_base: WriteFile() failed. GetLastError(): " + std::to_string(::GetLastError()));
    }
#else
    std::lock_guard<mutex_t> lock(mutex_);
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    ::fwrite(formatted.data(), sizeof(char), formatted.size(), file_);
    ::fflush(file_); // flush every line to terminal
#endif // WIN32
}